

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

void __thiscall CLI::App::_process_extras(App *this)

{
  pointer ppVar1;
  pointer psVar2;
  App *this_00;
  pointer ppVar3;
  ExtrasError *this_01;
  long lVar4;
  App_p *sub;
  pointer psVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  
  if ((this->allow_extras_ == false) && (this->prefix_command_ == false)) {
    ppVar3 = (this->missing_).
             super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar1 = (this->missing_).
             super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar3 != ppVar1) {
      lVar4 = 0;
      do {
        lVar4 = lVar4 + (ulong)(ppVar3->first != POSITIONAL_MARK);
        ppVar3 = ppVar3 + 1;
      } while (ppVar3 != ppVar1);
      if (lVar4 != 0) {
        this_01 = (ExtrasError *)__cxa_allocate_exception(0x38);
        remaining_abi_cxx11_(&local_30,this,false);
        ExtrasError::ExtrasError(this_01,&this->name_,&local_30);
        __cxa_throw(this_01,&ExtrasError::typeinfo,Error::~Error);
      }
    }
  }
  psVar2 = (this->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar5 = (this->subcommands_).
                super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar5 != psVar2; psVar5 = psVar5 + 1) {
    this_00 = (psVar5->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (this_00->parsed_ != 0) {
      _process_extras(this_00);
    }
  }
  return;
}

Assistant:

void _process_extras() {
        if(!(allow_extras_ || prefix_command_)) {
            std::size_t num_left_over = remaining_size();
            if(num_left_over > 0) {
                throw ExtrasError(name_, remaining(false));
            }
        }

        for(App_p &sub : subcommands_) {
            if(sub->count() > 0)
                sub->_process_extras();
        }
    }